

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void printCsvResult(Statement *query,ostream *stream,bool isFirstRow,bool clip)

{
  int32_t iVar1;
  char *__s;
  size_t sVar2;
  ostream *poVar3;
  bool bVar4;
  double dVar5;
  double dVar6;
  Column local_c8;
  Column local_b0;
  Column local_98;
  Column local_80;
  Column local_68;
  Column local_50;
  Column local_38;
  
  SQLite::Statement::getColumn(&local_68,query,0);
  __s = SQLite::Column::getText(&local_68,"");
  if (__s == (char *)0x0) {
    std::ios::clear((int)stream + (int)*(undefined8 *)(*(long *)stream + -0x18));
  }
  else {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(stream,__s,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,",",1);
  SQLite::Statement::getColumn(&local_80,query,1);
  dVar5 = SQLite::Column::getDouble(&local_80);
  poVar3 = std::ostream::_M_insert<double>(dVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
  SQLite::Statement::getColumn(&local_b0,query,2);
  dVar5 = SQLite::Column::getDouble(&local_b0);
  poVar3 = std::ostream::_M_insert<double>(dVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
  SQLite::Statement::getColumn(&local_c8,query,3);
  dVar5 = SQLite::Column::getDouble(&local_c8);
  poVar3 = std::ostream::_M_insert<double>(dVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
  SQLite::Statement::getColumn(&local_98,query,4);
  dVar5 = SQLite::Column::getDouble(&local_98);
  poVar3 = std::ostream::_M_insert<double>(dVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
  if (local_98.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_c8.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c8.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_b0.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b0.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_80.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_68.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (clip) {
    SQLite::Statement::getColumn(&local_68,query,5);
    dVar5 = SQLite::Column::getDouble(&local_68);
    SQLite::Statement::getColumn(&local_80,query,1);
    dVar6 = SQLite::Column::getDouble(&local_80);
    bVar4 = dVar6 < dVar5;
    if (local_80.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_80.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_68.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  else {
    bVar4 = false;
  }
  if (bVar4) {
    SQLite::Statement::getColumn(&local_b0,query,1);
    dVar5 = SQLite::Column::getDouble(&local_b0);
    poVar3 = std::ostream::_M_insert<double>(dVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
  }
  else {
    if (clip) {
      SQLite::Statement::getColumn(&local_b0,query,5);
      iVar1 = SQLite::Column::getInt(&local_b0);
      bVar4 = iVar1 == 0;
      if (local_b0.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_b0.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    }
    else {
      bVar4 = false;
    }
    if (bVar4) {
      std::__ostream_insert<char,std::char_traits<char>>(stream,"NaN,",4);
      goto LAB_00117529;
    }
    SQLite::Statement::getColumn(&local_c8,query,5);
    dVar5 = SQLite::Column::getDouble(&local_c8);
    poVar3 = std::ostream::_M_insert<double>(dVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
    local_b0.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = local_c8.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  }
  if (local_b0.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b0.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
LAB_00117529:
  if (clip) {
    SQLite::Statement::getColumn(&local_c8,query,6);
    dVar5 = SQLite::Column::getDouble(&local_c8);
    SQLite::Statement::getColumn(&local_98,query,3);
    dVar6 = SQLite::Column::getDouble(&local_98);
    bVar4 = dVar6 < dVar5;
    if (local_98.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_c8.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_c8.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  else {
    bVar4 = false;
  }
  if (bVar4) {
    SQLite::Statement::getColumn(&local_50,query,3);
    dVar5 = SQLite::Column::getDouble(&local_50);
    poVar3 = std::ostream::_M_insert<double>(dVar5);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  else {
    if (clip) {
      SQLite::Statement::getColumn(&local_50,query,6);
      iVar1 = SQLite::Column::getInt(&local_50);
      bVar4 = iVar1 == 0;
      if (local_50.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_50.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    }
    else {
      bVar4 = false;
    }
    if (bVar4) {
      std::__ostream_insert<char,std::char_traits<char>>(stream,"NaN",3);
      std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + (char)stream);
      std::ostream::put((char)stream);
      std::ostream::flush();
      return;
    }
    SQLite::Statement::getColumn(&local_38,query,6);
    dVar5 = SQLite::Column::getDouble(&local_38);
    poVar3 = std::ostream::_M_insert<double>(dVar5);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    local_50.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = local_38.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  }
  if (local_50.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void printCsvResult(SQLite::Statement& query, std::ostream& stream, bool isFirstRow, bool clip)
{
    stream << query.getColumn(0).getText()   << ","
           << query.getColumn(1).getDouble() << ","
           << query.getColumn(2).getDouble() << ","
           << query.getColumn(3).getDouble() << ","
           << query.getColumn(4).getDouble() << ",";

    if (clip && query.getColumn(5).getDouble() > query.getColumn(1).getDouble())
    {
        stream << query.getColumn(1).getDouble() << ",";
    }
    else if (clip && query.getColumn(5).getInt() == 0)
    {
        stream << "NaN,";
    }
    else
    {
        stream << query.getColumn(5).getDouble() << ",";
    }

    if (clip && query.getColumn(6).getDouble() > query.getColumn(3).getDouble())
    {
        stream << query.getColumn(3).getDouble() << std::endl;
    }
    else if (clip && query.getColumn(6).getInt() == 0)
    {
        stream << "NaN" << std::endl;
    }
    else
    {
        stream << query.getColumn(6).getDouble() << std::endl;
    }
}